

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjpeghandler.cpp
# Opt level: O2

bool write_jpeg_image(QImage *image,QIODevice *device,int sourceQuality,QString *description,
                     bool optimize,bool progressive,bool invertCMYK)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  JSAMPROW local_288;
  jpeg_compress_struct cinfo;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(&cinfo,&DAT_0010a220,0x248);
  local_288 = (JSAMPROW)0x0;
  bVar2 = do_write_jpeg_image(&cinfo,&local_288,image,device,sourceQuality,description,optimize,
                              progressive,invertCMYK);
  if (local_288 != (JSAMPROW)0x0) {
    operator_delete__(local_288);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool write_jpeg_image(const QImage &image,
                             QIODevice *device,
                             int sourceQuality,
                             const QString &description,
                             bool optimize,
                             bool progressive,
                             bool invertCMYK)
{
    // protect these objects from the setjmp/longjmp pair inside
    // do_write_jpeg_image (by making them non-local).
    struct jpeg_compress_struct cinfo;
    JSAMPROW row_pointer[1];
    row_pointer[0] = nullptr;

    const bool success = do_write_jpeg_image(cinfo, row_pointer,
                                             image, device,
                                             sourceQuality, description,
                                             optimize, progressive, invertCMYK);

    delete [] row_pointer[0];
    return success;
}